

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmutil.c
# Opt level: O0

PmError Pm_Dequeue(PmQueue *q,void *msg)

{
  long lVar1;
  int iVar2;
  int32_t j;
  int32_t *msg_as_int32;
  int i;
  PmQueueRep *queue;
  long head;
  void *msg_local;
  PmQueue *q_local;
  
  if (q == (PmQueue *)0x0) {
    q_local._4_4_ = pmBadPtr;
  }
  else if (*(int *)((long)q + 0x24) == 0) {
    if (*(int *)((long)q + 0x38) == 0) {
      lVar1 = *q;
      if ((*(long *)((long)q + 0x18) == lVar1 + 1) &&
         (*(int *)(*(long *)((long)q + 0x28) + lVar1 * 4) == 0)) {
        *(undefined8 *)((long)q + 0x18) = 0;
        q_local._4_4_ = pmBufferOverflow;
      }
      else {
        msg_as_int32._4_4_ = *(int *)((long)q + 0x20);
        do {
          msg_as_int32._4_4_ = msg_as_int32._4_4_ + -1;
          if (msg_as_int32._4_4_ < 0) {
            memcpy(msg,(void *)(*(long *)((long)q + 0x28) + (lVar1 + 1) * 4),
                   (long)(*(int *)((long)q + 0x20) + -1) << 2);
            msg_as_int32._4_4_ = *(int *)(*(long *)((long)q + 0x28) + lVar1 * 4);
            while (msg_as_int32._4_4_ < *(int *)((long)q + 0x20)) {
              iVar2 = msg_as_int32._4_4_ + -1;
              msg_as_int32._4_4_ = *(int *)((long)msg + (long)iVar2 * 4);
              *(undefined4 *)((long)msg + (long)iVar2 * 4) = 0;
            }
            memset((void *)(*(long *)((long)q + 0x28) + lVar1 * 4),0,
                   (long)*(int *)((long)q + 0x20) << 2);
            queue = (PmQueueRep *)(*(int *)((long)q + 0x20) + lVar1);
            if (queue == *(PmQueueRep **)((long)q + 0x10)) {
              queue = (PmQueueRep *)0x0;
            }
            *(PmQueueRep **)q = queue;
            return pmGotData;
          }
        } while (*(int *)(*(long *)((long)q + 0x28) + (lVar1 + msg_as_int32._4_4_) * 4) != 0);
        q_local._4_4_ = pmNoData;
      }
    }
    else {
      memcpy(msg,*(void **)((long)q + 0x30),(long)(*(int *)((long)q + 0x20) + -1) << 2);
      *(undefined4 *)((long)q + 0x38) = 0;
      q_local._4_4_ = pmGotData;
    }
  }
  else {
    *(undefined4 *)((long)q + 0x24) = 0;
    q_local._4_4_ = pmBufferOverflow;
  }
  return q_local._4_4_;
}

Assistant:

PMEXPORT PmError Pm_Dequeue(PmQueue *q, void *msg)
{
    long head;
    PmQueueRep *queue = (PmQueueRep *) q;
    int i;
    int32_t *msg_as_int32 = (int32_t *) msg;

    /* arg checking */
    if (!queue)
        return pmBadPtr;
    /* a previous peek operation encountered an overflow, but the overflow
     * has not yet been reported to client, so do it now. No message is
     * returned, but on the next call, we will return the peek buffer.
     */
    if (queue->peek_overflow) {
        queue->peek_overflow = FALSE;
        return pmBufferOverflow;
    }
    if (queue->peek_flag) {
        memcpy(msg, queue->peek, (queue->msg_size - 1) * sizeof(int32_t));
        queue->peek_flag = FALSE;
        return pmGotData;
    }

    head = queue->head;
    /* if writer overflows, it writes queue->overflow = tail+1 so that
     * when the reader gets to that position in the buffer, it can 
     * return the overflow condition to the reader. The problem is that
     * at overflow, things have wrapped around, so tail == head, and the
     * reader will detect overflow immediately instead of waiting until
     * it reads everything in the buffer, wrapping around again to the
     * point where tail == head. So the condition also checks that
     * queue->buffer[head] is zero -- if so, then the buffer is now
     * empty, and we're at the point in the msg stream where overflow
     * occurred. It's time to signal overflow to the reader. If 
     * queue->buffer[head] is non-zero, there's a message there and we
     * should read all the way around the buffer before signalling overflow.
     * There is a write-order dependency here, but to fail, the overflow
     * field would have to be written while an entire buffer full of 
     * writes are still pending. I'm assuming out-of-order writes are
     * possible, but not that many.
     */
    if (queue->overflow == head + 1 && !queue->buffer[head]) {
        queue->overflow = 0; /* non-overflow condition */
        return pmBufferOverflow;
    }

    /* test to see if there is data in the queue -- test from back
     * to front so if writer is simultaneously writing, we don't
     * waste time discovering the write is not finished 
     */
    for (i = queue->msg_size - 1; i >= 0; i--) {
        if (!queue->buffer[head + i]) {
            return pmNoData;
        }
    }
    memcpy(msg, (char *) &queue->buffer[head + 1], 
           sizeof(int32_t) * (queue->msg_size - 1));
    /* fix up zeros */
    i = queue->buffer[head];
    while (i < queue->msg_size) {
        int32_t j;
        i--; /* msg does not have extra word so shift down */
        j = msg_as_int32[i];
        msg_as_int32[i] = 0;
        i = j;
    }
    /* signal that data has been removed by zeroing: */
    bzero((char *) &queue->buffer[head], sizeof(int32_t) * queue->msg_size);

    /* update head */
    head += queue->msg_size;
    if (head == queue->len) head = 0;
    queue->head = head;
    return pmGotData; /* success */
}